

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Routing.cpp
# Opt level: O3

void RoutingDemo_GetData(int target,float *data,int numsamples,int numchannels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  float *pfVar9;
  ulong uVar10;
  
  if ((uint)target < 0x10) {
    uVar5 = (ulong)(uint)target;
    iVar1 = *(int *)(Routing::bufferchannels + uVar5 * 4);
    iVar4 = iVar1 - numchannels;
    if (iVar1 - numchannels < 1) {
      iVar4 = 0;
    }
    if (0 < numsamples) {
      piVar6 = &Routing::buffer + uVar5 * 0x10002;
      iVar2 = iVar1;
      if (numchannels < iVar1) {
        iVar2 = numchannels;
      }
      uVar10 = 0;
      pfVar9 = data;
      do {
        if (0 < numchannels) {
          uVar7 = 0;
          do {
            iVar8 = *piVar6;
            if (iVar8 != (&DAT_00438384)[uVar5 * 0x10002]) {
              iVar3 = iVar8 + 1;
              if (iVar8 == 0xffff) {
                iVar3 = 0;
              }
              pfVar9[uVar7] = *(float *)(&DAT_00438388 + (long)iVar3 * 4 + uVar5 * 0x40008);
              *piVar6 = iVar3;
            }
            uVar7 = uVar7 + 1;
          } while ((uint)numchannels != uVar7);
        }
        iVar3 = *piVar6 + iVar4;
        iVar8 = *piVar6 + -0x10000 + iVar4;
        if (iVar3 < 0x10000) {
          iVar8 = iVar3;
        }
        *piVar6 = iVar8;
        uVar7 = (ulong)(uint)(numchannels - iVar1);
        iVar8 = iVar2;
        if (0 < numchannels - iVar1) {
          do {
            data[iVar8] = 0.0;
            iVar8 = iVar8 + 1;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        uVar10 = uVar10 + 1;
        pfVar9 = pfVar9 + (uint)numchannels;
        iVar2 = iVar2 + numchannels;
      } while (uVar10 != (uint)numsamples);
    }
  }
  return;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API void RoutingDemo_GetData(int target, float* data, int numsamples, int numchannels)
{
    if (target < 0 || target >= Routing::MAXINDEX)
        return;
    int skipchannels = Routing::bufferchannels[target] - numchannels; if (skipchannels < 0)
        skipchannels = 0;
    int zerochannels = numchannels - Routing::bufferchannels[target]; if (zerochannels < 0)
        zerochannels = 0;
    for (int n = 0; n < numsamples; n++)
    {
        for (int i = 0; i < numchannels; i++)
            Routing::buffer[target].Read(data[n * numchannels + i]);
        Routing::buffer[target].Skip(skipchannels);
        for (int i = 0; i < zerochannels; i++)
            data[n * numchannels + i + numchannels - zerochannels] = 0.0f;
    }
}